

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
PairMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
::ExplainSuccess(PairMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                 *this,string *first_explanation,string *second_explanation,
                MatchResultListener *listener)

{
  MatchResultListener *pMVar1;
  
  MatchResultListener::operator<<(listener,(char (*) [24])"whose both fields match");
  if (first_explanation->_M_string_length != 0) {
    pMVar1 = MatchResultListener::operator<<
                       (listener,(char (*) [36])", where the first field is a value ");
    MatchResultListener::operator<<(pMVar1,first_explanation);
  }
  if (second_explanation->_M_string_length != 0) {
    MatchResultListener::operator<<(listener,(char (*) [3])0x1026887);
    if (first_explanation->_M_string_length == 0) {
      MatchResultListener::operator<<(listener,(char (*) [7])0x11470db);
    }
    else {
      MatchResultListener::operator<<(listener,(char (*) [5])0xd52ec5);
    }
    pMVar1 = MatchResultListener::operator<<(listener,(char (*) [29])"the second field is a value ")
    ;
    MatchResultListener::operator<<(pMVar1,second_explanation);
    return;
  }
  return;
}

Assistant:

void ExplainSuccess(const std::string& first_explanation,
                      const std::string& second_explanation,
                      MatchResultListener* listener) const {
    *listener << "whose both fields match";
    if (!first_explanation.empty()) {
      *listener << ", where the first field is a value " << first_explanation;
    }
    if (!second_explanation.empty()) {
      *listener << ", ";
      if (!first_explanation.empty()) {
        *listener << "and ";
      } else {
        *listener << "where ";
      }
      *listener << "the second field is a value " << second_explanation;
    }
  }